

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void * cmGetSource(void *arg,char *name)

{
  bool bVar1;
  cmSourceFile *pcVar2;
  pointer pcVar3;
  string *psVar4;
  pointer ppVar5;
  pair<std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>,_bool>
  pVar6;
  string local_c0;
  string local_a0;
  unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_> local_80;
  __single_object sf;
  _Self local_70;
  iterator i;
  allocator<char> local_51;
  string local_50;
  cmSourceFile *local_30;
  cmSourceFile *rsf;
  cmMakefile *mf;
  char *name_local;
  void *arg_local;
  
  rsf = (cmSourceFile *)arg;
  mf = (cmMakefile *)name;
  name_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  pcVar2 = cmMakefile::GetSource((cmMakefile *)arg,&local_50,Ambiguous);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (pcVar2 == (cmSourceFile *)0x0) {
    arg_local = (void *)0x0;
  }
  else {
    local_30 = pcVar2;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<cmSourceFile_*,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>_>
         ::find(&cmCPluginAPISourceFiles,&local_30);
    sf._M_t.
    super___uniq_ptr_impl<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>._M_t
    .super__Tuple_impl<0UL,_cmCPluginAPISourceFile_*,_std::default_delete<cmCPluginAPISourceFile>_>.
    super__Head_base<0UL,_cmCPluginAPISourceFile_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>,_true,_true>
          )std::
           map<cmSourceFile_*,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>_>
           ::end(&cmCPluginAPISourceFiles);
    bVar1 = std::operator==(&local_70,(_Self *)&sf);
    if (bVar1) {
      std::make_unique<cmCPluginAPISourceFile>();
      pcVar2 = local_30;
      pcVar3 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
               ::operator->(&local_80);
      pcVar3->RealSourceFile = pcVar2;
      psVar4 = cmSourceFile::ResolveFullPath(local_30,(string *)0x0,(string *)0x0);
      pcVar3 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
               ::operator->(&local_80);
      std::__cxx11::string::operator=((string *)&pcVar3->FullPath,(string *)psVar4);
      pcVar3 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
               ::operator->(&local_80);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_a0,&pcVar3->FullPath);
      pcVar3 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
               ::operator->(&local_80);
      std::__cxx11::string::operator=((string *)&pcVar3->SourceName,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      pcVar3 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
               ::operator->(&local_80);
      cmsys::SystemTools::GetFilenameLastExtension(&local_c0,&pcVar3->FullPath);
      pcVar3 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
               ::operator->(&local_80);
      std::__cxx11::string::operator=((string *)&pcVar3->SourceExtension,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      pVar6 = std::
              map<cmSourceFile*,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
              ::
              emplace<cmSourceFile*&,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>
                        ((map<cmSourceFile*,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
                          *)&cmCPluginAPISourceFiles,&local_30,&local_80);
      local_70._M_node = (_Base_ptr)pVar6.first._M_node;
      std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
      ~unique_ptr(&local_80);
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>
             ::operator->(&local_70);
    arg_local = std::
                unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
                get(&ppVar5->second);
  }
  return arg_local;
}

Assistant:

static void CCONV* cmGetSource(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  if (cmSourceFile* rsf = mf->GetSource(name)) {
    // Lookup the proxy source file object for this source.
    auto i = cmCPluginAPISourceFiles.find(rsf);
    if (i == cmCPluginAPISourceFiles.end()) {
      // Create a proxy source file object for this source.
      auto sf = cm::make_unique<cmCPluginAPISourceFile>();
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->ResolveFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be re-used and deleted later.
      i = cmCPluginAPISourceFiles.emplace(rsf, std::move(sf)).first;
    }
    return i->second.get();
  }
  return nullptr;
}